

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

RPCErrorCode RPCErrorFromTransactionError(TransactionError terr)

{
  RPCErrorCode RVar1;
  long in_FS_OFFSET;
  
  RVar1 = RPC_TRANSACTION_REJECTED;
  if (terr != MEMPOOL_REJECTED) {
    RVar1 = (uint)(terr != ALREADY_IN_UTXO_SET) * 2 | RPC_VERIFY_ALREADY_IN_UTXO_SET;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return RVar1;
  }
  __stack_chk_fail();
}

Assistant:

RPCErrorCode RPCErrorFromTransactionError(TransactionError terr)
{
    switch (terr) {
        case TransactionError::MEMPOOL_REJECTED:
            return RPC_TRANSACTION_REJECTED;
        case TransactionError::ALREADY_IN_UTXO_SET:
            return RPC_VERIFY_ALREADY_IN_UTXO_SET;
        default: break;
    }
    return RPC_TRANSACTION_ERROR;
}